

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O2

int GetQCost(int nVars,int nNegs)

{
  int iVar1;
  int iVar2;
  
  if (nVars < nNegs) {
    __assert_fail("nVars >= nNegs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exor.c"
                  ,99,"int GetQCost(int, int)");
  }
  iVar2 = 1;
  switch(nVars) {
  case 0:
    goto switchD_002f17b4_caseD_0;
  case 1:
    if (nNegs == 0) {
      return 1;
    }
    if (nNegs == 1) {
      return 2;
    }
    break;
  case 2:
    if (nNegs < 2) {
      return 5;
    }
    if (nNegs == 2) {
      return 6;
    }
    break;
  case 3:
    if (nNegs < 2) {
      return 0xe;
    }
    if (nNegs == 2) {
      return 0x10;
    }
    if (nNegs == 3) {
      return 0x12;
    }
  }
  iVar1 = nVars / -2 + nNegs;
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1 * 2;
  }
  iVar2 = nVars * 0xc + iVar2 + -0x1c;
switchD_002f17b4_caseD_0:
  return iVar2;
}

Assistant:

int GetQCost( int nVars, int nNegs )
{
    int Extra;
    assert( nVars >= nNegs );
    if ( nVars == 0 )  
        return 1;
    if ( nVars == 1 )  
    {
        if ( nNegs == 0 )  return 1;
        if ( nNegs == 1 )  return 2;
    }
    if ( nVars == 2 )
    {
        if ( nNegs <= 1 )  return 5;
        if ( nNegs == 2 )  return 6;
    }
    if ( nVars == 3 )
    {
        if ( nNegs <= 1 )  return 14;
        if ( nNegs == 2 )  return 16;
        if ( nNegs == 3 )  return 18;
    }
    Extra = nNegs - nVars/2;
    return 20 + 12 * (nVars - 4) + (Extra > 0 ? 2 * Extra : 0);

}